

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

void write_sb_size(SequenceHeader *seq_params,aom_write_bit_buffer *wb)

{
  aom_write_bit_buffer *in_RSI;
  long in_RDI;
  
  aom_wb_write_bit(in_RSI,(uint)(*(char *)(in_RDI + 0x1c) == '\x0f'));
  return;
}

Assistant:

static inline void write_sb_size(const SequenceHeader *const seq_params,
                                 struct aom_write_bit_buffer *wb) {
  (void)seq_params;
  (void)wb;
  assert(seq_params->mib_size == mi_size_wide[seq_params->sb_size]);
  assert(seq_params->mib_size == 1 << seq_params->mib_size_log2);
  assert(seq_params->sb_size == BLOCK_128X128 ||
         seq_params->sb_size == BLOCK_64X64);
  aom_wb_write_bit(wb, seq_params->sb_size == BLOCK_128X128 ? 1 : 0);
}